

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

benchmark_function __thiscall
nonius::detail::benchmark_function::operator()(benchmark_function *this,parameters *params)

{
  pointer pcVar1;
  parameters *in_RDX;
  _Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  in_RDI;
  _Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false> _Var2;
  undefined1 local_50 [80];
  
  _Var2._M_head_impl =
       (concept *)
       in_RDI.super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>.
       _M_head_impl;
  pcVar1 = std::
           unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
           ::operator->((unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                         *)0x24d364);
  parameters::parameters(in_RDX,(parameters *)_Var2._M_head_impl);
  (**pcVar1->_vptr_concept)
            (in_RDI.super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>.
             _M_head_impl,pcVar1,local_50);
  parameters::~parameters((parameters *)0x24d3a0);
  return (unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
          )(unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
            )_Var2._M_head_impl;
}

Assistant:

benchmark_function operator()(parameters params) const { return f->call(params); }